

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O1

Status __thiscall osqp::OsqpSolver::UpdateVerbose(OsqpSolver *this,bool verbose_new)

{
  c_int cVar1;
  byte in_DL;
  undefined7 in_register_00000031;
  string_view message;
  string_view message_00;
  
  if (*(OSQPWorkspace **)CONCAT71(in_register_00000031,verbose_new) == (OSQPWorkspace *)0x0) {
    message_00._M_str = (char *)0x1e;
    message_00._M_len = (size_t)this;
    absl::FailedPreconditionError(message_00);
  }
  else {
    cVar1 = osqp_update_verbose(*(OSQPWorkspace **)CONCAT71(in_register_00000031,verbose_new),
                                (ulong)in_DL);
    if (cVar1 == 0) {
      (this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
           (OSQPWorkspaceHelper *)0x1;
    }
    else {
      message._M_str = (char *)0x28;
      message._M_len = (size_t)this;
      absl::UnknownError(message);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateVerbose(const bool verbose_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (osqp_update_verbose(workspace_.get(), verbose_new) != 0) {
    return absl::UnknownError("osqp_update_verbose unexpectedly failed.");
  }
  return absl::OkStatus();
}